

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O3

string * to_string<std::__cxx11::string>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ostringstream ss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(T value)
{
    std::ostringstream ss;
    ss << value;
    return ss.str();
}